

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void t1_dec_refpass_step_mqc(opj_t1_t *t1,flag_t *flagsp,int *datap,int poshalf,int neghalf)

{
  long lVar1;
  int iVar2;
  opj_mqc_t *mqc_00;
  int in_ECX;
  int *in_RDX;
  ushort *in_RSI;
  long in_RDI;
  int in_R8D;
  opj_mqc_t *mqc;
  int flag;
  int t;
  int v;
  int local_48;
  int local_44;
  
  lVar1 = *(long *)(in_RDI + 8);
  if (((int)(short)*in_RSI & 0x5000U) == 0x1000) {
    mqc_00 = (opj_mqc_t *)(lVar1 + 0x28);
    iVar2 = t1_getctxno_mag((int)(short)*in_RSI);
    *(opj_mqc_state_t ***)(lVar1 + 0xc0) = mqc_00->ctxs + (long)iVar2 + -5;
    iVar2 = mqc_decode(mqc_00);
    local_44 = in_R8D;
    if (iVar2 != 0) {
      local_44 = in_ECX;
    }
    if (*in_RDX < 0) {
      local_48 = -local_44;
    }
    else {
      local_48 = local_44;
    }
    *in_RDX = local_48 + *in_RDX;
    *in_RSI = *in_RSI | 0x2000;
  }
  return;
}

Assistant:

static INLINE void t1_dec_refpass_step_mqc(
		opj_t1_t *t1,
		flag_t *flagsp,
		int *datap,
		int poshalf,
		int neghalf)
{
	int v, t, flag;
	
	opj_mqc_t *mqc = t1->mqc;	/* MQC component */
	
	flag = *flagsp;
	if ((flag & (T1_SIG | T1_VISIT)) == T1_SIG) {
		mqc_setcurctx(mqc, t1_getctxno_mag(flag));	/* ESSAI */
			v = mqc_decode(mqc);
		t = v ? poshalf : neghalf;
		*datap += *datap < 0 ? -t : t;
		*flagsp |= T1_REFINE;
		}
}